

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void * __thiscall
kj::anon_unknown_59::InMemoryFile::mmap
          (InMemoryFile *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  Mutex *this_00;
  undefined8 *puVar1;
  undefined4 in_register_0000000c;
  _func_int **pp_Var2;
  ulong uVar3;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint64_t offset_local;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  
  pp_Var2 = (_func_int **)CONCAT44(in_register_0000000c,__prot);
  _kjCondition.right = &offset_local;
  uVar3 = (long)pp_Var2 + __len;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = __len <= uVar3;
  offset_local = __len;
  if (_kjCondition.result) {
    this_00 = (Mutex *)((long)__addr + 0x18);
    _kjCondition.left = uVar3 & 0xffffffffffffff00;
    kj::_::Mutex::lock(this_00,0,&_kjCondition,uVar3,CONCAT44(in_register_00000084,__flags),
                       CONCAT44(in_register_0000008c,__fd));
    lock.ptr = (Impl *)((long)__addr + 0x30);
    lock.mutex = this_00;
    Impl::ensureCapacity(lock.ptr,offset_local + (long)pp_Var2);
    puVar1 = (undefined8 *)operator_new(0x18);
    LOCK();
    *(int *)((long)__addr + 0x10) = *(int *)((long)__addr + 0x10) + 1;
    UNLOCK();
    *puVar1 = &PTR_disposeImpl_0064bb88;
    puVar1[1] = (long)__addr + 8;
    puVar1[2] = __addr;
    *(int *)((long)__addr + 0x60) = *(int *)((long)__addr + 0x60) + 1;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)(*(long *)((long)__addr + 0x38) + offset_local);
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var2;
    *(undefined8 **)&(this->super_AtomicRefcounted).refcount = puVar1;
    kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    return this;
  }
  _kjCondition.left = uVar3;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[32]>
            ((Fault *)&lock,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x32c,FAILED,"offset + size >= offset",
             "_kjCondition,\"mmap() request overflows uint64\"",&_kjCondition,
             (char (*) [32])"mmap() request overflows uint64");
  kj::_::Debug::Fault::fatal((Fault *)&lock);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const override {
    KJ_REQUIRE(offset + size >= offset, "mmap() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(offset + size);

    ArrayDisposer* disposer = new MmapDisposer(atomicAddRef(*this));
    return Array<const byte>(lock->bytes.begin() + offset, size, *disposer);
  }